

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http2.c
# Opt level: O0

int lws_h2_client_handshake(lws *wsi)

{
  lws_context_per_thread *wsi_00;
  uint uVar1;
  int iVar2;
  lws_dll2 *__s;
  lws *plVar3;
  char *pcVar4;
  uchar *end_00;
  size_t sVar5;
  uint8_t *puVar6;
  lws_write_protocol local_78;
  uint sid;
  int m;
  int n;
  char *path;
  lws *nwsi;
  char *simp;
  char *uri;
  char *meth;
  uint8_t *end;
  uint8_t *p1;
  uint8_t *p;
  uint8_t *start;
  uint8_t *buf;
  lws_context_per_thread *pt;
  lws *wsi_local;
  
  buf = (uint8_t *)(((wsi->a).context)->pt + (int)wsi->tsi);
  pt = (lws_context_per_thread *)wsi;
  uri = lws_hdr_simple_ptr(wsi,_WSI_TOKEN_CLIENT_METHOD);
  __s = (lws_dll2 *)lws_hdr_simple_ptr((lws *)pt,_WSI_TOKEN_CLIENT_URI);
  plVar3 = lws_get_network_wsi((lws *)pt);
  _m = (lws_dll2 *)0x163674;
  uVar1 = ((plVar3->h2).h2n)->highest_sid_opened + 2;
  _lws_log(0x10,"%s\n","lws_h2_client_handshake");
  ((plVar3->h2).h2n)->highest_sid_opened = uVar1;
  *(uint *)&(pt->sul_plat).us = uVar1;
  pcVar4 = lws_wsi_tag((lws *)pt);
  _lws_log(8,"%s: %s: assigning SID %d at header send\n","lws_h2_client_handshake",pcVar4,
           (ulong)uVar1);
  _lws_log(8,"%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n","lws_h2_client_handshake",
           (ulong)(uint)(pt->sul_plat).us);
  wsi_00 = pt;
  p1 = (uint8_t *)(*(long *)(buf + 0x130) + 0x10);
  end_00 = p1 + ((ulong)(*(uint *)((long)&(pt->dll_buflist_owner).tail[0x51].prev + 4) >> 1) - 0x11)
  ;
  if (uri == (char *)0x0) {
    uri = "GET";
  }
  p = p1;
  start = p1;
  sVar5 = strlen(uri);
  iVar2 = lws_add_http_header_by_token
                    ((lws *)wsi_00,WSI_TOKEN_HTTP_COLON_METHOD,(uchar *)uri,(int)sVar5,&p1,end_00);
  if ((iVar2 == 0) &&
     (iVar2 = lws_add_http_header_by_token
                        ((lws *)pt,WSI_TOKEN_HTTP_COLON_SCHEME,(uchar *)"https",5,&p1,end_00),
     iVar2 == 0)) {
    sid = lws_hdr_total_length((lws *)pt,_WSI_TOKEN_CLIENT_URI);
    if (sid == 0) {
      if ((pt[2].pt_sul_owner[0].tail == (lws_dll2 *)0x0) ||
         ((pt[2].pt_sul_owner[0].tail)->next == (lws_dll2 *)0x0)) {
        sid = 1;
        __s = _m;
      }
      else {
        __s = (pt[2].pt_sul_owner[0].tail)->next;
        sVar5 = strlen((char *)__s);
        sid = (uint)sVar5;
      }
    }
    _m = __s;
    if (((1 < (int)sid) && (*(uchar *)&_m->prev == '/')) && (*(uchar *)((long)&_m->prev + 1) == '/')
       ) {
      _m = (lws_dll2 *)((long)&_m->prev + 1);
      sid = sid - 1;
    }
    if ((sid == 0) ||
       (iVar2 = lws_add_http_header_by_token
                          ((lws *)pt,WSI_TOKEN_HTTP_COLON_PATH,(uchar *)_m,sid,&p1,end_00),
       iVar2 == 0)) {
      sid = lws_hdr_total_length((lws *)pt,_WSI_TOKEN_CLIENT_HOST);
      nwsi = (lws *)lws_hdr_simple_ptr((lws *)pt,_WSI_TOKEN_CLIENT_HOST);
      if ((sid == 0) &&
         ((pt[2].pt_sul_owner[0].tail != (lws_dll2 *)0x0 &&
          ((pt[2].pt_sul_owner[0].tail)->prev != (lws_dll2 *)0x0)))) {
        sVar5 = strlen((char *)(pt[2].pt_sul_owner[0].tail)->prev);
        sid = (uint)sVar5;
        nwsi = (lws *)(pt[2].pt_sul_owner[0].tail)->prev;
      }
      if ((((sid == 0) || (nwsi == (lws *)0x0)) ||
          (iVar2 = lws_add_http_header_by_token
                             ((lws *)pt,WSI_TOKEN_HOST,(uchar *)nwsi,sid,&p1,end_00), iVar2 == 0))
         && ((puVar6 = p1, (*(uint *)&pt[2].tls.dll_pending_tls_owner.field_0x14 & 0x400) == 0 ||
             (puVar6 = lws_http_multipart_headers((lws *)pt,p1), puVar6 != (uint8_t *)0x0)))) {
        p1 = puVar6;
        if ((*(uint *)&pt[2].tls.dll_pending_tls_owner.field_0x14 & 0x800) != 0) {
          iVar2 = lws_add_http_header_by_token
                            ((lws *)pt,WSI_TOKEN_HTTP_CONTENT_TYPE,
                             (uchar *)"application/x-www-form-urlencoded",0x21,&p1,end_00);
          if (iVar2 != 0) goto LAB_0013a249;
          lws_client_http_body_pending((lws *)pt,1);
        }
        if ((*(uint *)&pt[2].tls.dll_pending_tls_owner.field_0x14 & 0x40000000) != 0) {
          lws_cookie_send_cookies((lws *)pt,(char **)&p1,(char *)end_00);
        }
        iVar2 = (**(code **)(*(long *)&(pt->dll_buflist_owner).count + 8))
                          (pt,0x18,pt[2].sul_ah_lifecheck.list.owner,&p1,end_00 + (-0xc - (long)p1))
        ;
        if ((iVar2 == 0) && (iVar2 = lws_finalize_http_header((lws *)pt,&p1,end_00), iVar2 == 0)) {
          local_78 = LWS_WRITE_HTTP_HEADERS;
          if (((*(uint *)&pt[2].tls.dll_pending_tls_owner.field_0x14 & 0x20) != 0) &&
             (((*(ulong *)((long)&pt[2].context + 6) >> 0x34 & 1) == 0 &&
              (iVar2 = lws_has_buffered_out((lws *)pt), iVar2 == 0)))) {
            local_78 = LWS_WRITE_CLIENT_IGNORE_XOR_MASK|LWS_WRITE_HTTP_HEADERS;
          }
          uVar1 = lws_write((lws *)pt,p,(long)p1 - (long)p,local_78);
          if (uVar1 != (int)p1 - (int)p) {
            _lws_log(1,"_write returned %d from %ld\n",(ulong)uVar1,(long)p1 - (long)p);
            return -1;
          }
          sid = 0x40000;
          if ((*(uint *)&pt[2].tls.dll_pending_tls_owner.field_0x14 & 0x200) != 0) {
            sid = *(uint *)&pt->fake_wsi;
            *(undefined1 *)((long)&pt->fake_wsi + 5) = 1;
          }
          iVar2 = lws_h2_update_peer_txcredit((lws *)pt,(uint)(pt->sul_plat).us,sid);
          if (iVar2 != 0) {
            return 1;
          }
          lws_h2_state((lws *)pt,LWS_H2_STATE_OPEN);
          lwsi_set_state((lws *)pt,0x119);
          if ((*(uint *)&pt[2].tls.dll_pending_tls_owner.field_0x14 & 0x400) != 0) {
            lws_callback_on_writable((lws *)pt);
          }
          return 0;
        }
      }
    }
  }
LAB_0013a249:
  _lws_log(1,"Client hdrs too long: incr context info.pt_serv_buf_size\n");
  return -1;
}

Assistant:

int
lws_h2_client_handshake(struct lws *wsi)
{
	struct lws_context_per_thread *pt = &wsi->a.context->pt[(int)wsi->tsi];
	uint8_t *buf, *start, *p, *p1, *end;
	char *meth = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_METHOD),
	     *uri = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_URI), *simp;
	struct lws *nwsi = lws_get_network_wsi(wsi);
	const char *path = "/";
	int n, m;
	/*
	 * The identifier of a newly established stream MUST be numerically
	 * greater than all streams that the initiating endpoint has opened or
	 * reserved.  This governs streams that are opened using a HEADERS frame
	 * and streams that are reserved using PUSH_PROMISE.  An endpoint that
	 * receives an unexpected stream identifier MUST respond with a
	 * connection error (Section 5.4.1) of type PROTOCOL_ERROR.
	 */
	unsigned int sid = nwsi->h2.h2n->highest_sid_opened + 2;

	lwsl_debug("%s\n", __func__);

	/*
	 * We MUST allocate our sid here at the point we're about to send the
	 * stream open.  It's because we don't know the order in which multiple
	 * open streams will send their headers... in h2, sending the headers
	 * is the point the stream is opened.  The peer requires that we only
	 * open streams in ascending sid order
	 */

	wsi->mux.my_sid = nwsi->h2.h2n->highest_sid_opened = sid;
	lwsl_info("%s: %s: assigning SID %d at header send\n", __func__,
			lws_wsi_tag(wsi), sid);


	lwsl_info("%s: CLIENT_WAITING_TO_SEND_HEADERS: pollout (sid %d)\n",
			__func__, wsi->mux.my_sid);

	p = start = buf = pt->serv_buf + LWS_PRE;
	end = start + (wsi->a.context->pt_serv_buf_size / 2) - LWS_PRE - 1;

	/* it's time for us to send our client stream headers */

	if (!meth)
		meth = "GET";

	/* h2 pseudoheaders must be in a bunch at the start */

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_METHOD,
				(unsigned char *)meth,
				(int)strlen(meth), &p, end))
		goto fail_length;

	if (lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_SCHEME,
				(unsigned char *)"https", 5,
				&p, end))
		goto fail_length;


	n = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_URI);
	if (n)
		path = uri;
	else
		if (wsi->stash && wsi->stash->cis[CIS_PATH]) {
			path = wsi->stash->cis[CIS_PATH];
			n = (int)strlen(path);
		} else
			n = 1;

	if (n > 1 && path[0] == '/' && path[1] == '/') {
		path++;
		n--;
	}

	if (n && lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_PATH,
				(unsigned char *)path, n, &p, end))
		goto fail_length;

	n = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_HOST);
	simp = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_HOST);
	if (!n && wsi->stash && wsi->stash->cis[CIS_ADDRESS]) {
		n = (int)strlen(wsi->stash->cis[CIS_ADDRESS]);
		simp = wsi->stash->cis[CIS_ADDRESS];
	}

//	n = lws_hdr_total_length(wsi, _WSI_TOKEN_CLIENT_ORIGIN);
//	simp = lws_hdr_simple_ptr(wsi, _WSI_TOKEN_CLIENT_ORIGIN);
#if 0
	if (n && simp && lws_add_http_header_by_token(wsi,
				WSI_TOKEN_HTTP_COLON_AUTHORITY,
				(unsigned char *)simp, n, &p, end))
		goto fail_length;
#endif


	if (/*!wsi->client_h2_alpn && */n && simp &&
	    lws_add_http_header_by_token(wsi, WSI_TOKEN_HOST,
				(unsigned char *)simp, n, &p, end))
		goto fail_length;


	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME) {
		p1 = lws_http_multipart_headers(wsi, p);
		if (!p1)
			goto fail_length;
		p = p1;
	}

	if (wsi->flags & LCCSCF_HTTP_X_WWW_FORM_URLENCODED) {
		if (lws_add_http_header_by_token(wsi, WSI_TOKEN_HTTP_CONTENT_TYPE,
			   (unsigned char *)"application/x-www-form-urlencoded",
			   33, &p, end))
			goto fail_length;
		lws_client_http_body_pending(wsi, 1);
	}

	/* give userland a chance to append, eg, cookies */

#if defined(LWS_WITH_CACHE_NSCOOKIEJAR) && defined(LWS_WITH_CLIENT)
	if (wsi->flags & LCCSCF_CACHE_COOKIES)
		lws_cookie_send_cookies(wsi, (char **)&p, (char *)end);
#endif

	if (wsi->a.protocol->callback(wsi,
				LWS_CALLBACK_CLIENT_APPEND_HANDSHAKE_HEADER,
				wsi->user_space, &p, lws_ptr_diff_size_t(end, p) - 12))
		goto fail_length;

	if (lws_finalize_http_header(wsi, &p, end))
		goto fail_length;

	m = LWS_WRITE_HTTP_HEADERS;
#if defined(LWS_WITH_CLIENT)
	/* below is not needed in spec, indeed it destroys the long poll
	 * feature, but required by nghttp2 */
	if ((wsi->flags & LCCSCF_H2_QUIRK_NGHTTP2_END_STREAM) &&
	    !(wsi->client_http_body_pending  || lws_has_buffered_out(wsi)))
		m |= LWS_WRITE_H2_STREAM_END;
#endif

	// lwsl_hexdump_notice(start, p - start);

	n = lws_write(wsi, start, lws_ptr_diff_size_t(p, start), (enum lws_write_protocol)m);

	if (n != lws_ptr_diff(p, start)) {
		lwsl_err("_write returned %d from %ld\n", n,
			 (long)(p - start));
		return -1;
	}

	/*
	 * Normally let's charge up the peer tx credit a bit.  But if
	 * MANUAL_REFLOW is set, just set it to the initial credit given in
	 * the client create info
	 */

	n = 4 * 65536;
	if (wsi->flags & LCCSCF_H2_MANUAL_RXFLOW) {
		n = wsi->txc.manual_initial_tx_credit;
		wsi->txc.manual = 1;
	}

	if (lws_h2_update_peer_txcredit(wsi, wsi->mux.my_sid, n))
		return 1;

	lws_h2_state(wsi, LWS_H2_STATE_OPEN);
	lwsi_set_state(wsi, LRS_ESTABLISHED);

	if (wsi->flags & LCCSCF_HTTP_MULTIPART_MIME)
		lws_callback_on_writable(wsi);

	return 0;

fail_length:
	lwsl_err("Client hdrs too long: incr context info.pt_serv_buf_size\n");

	return -1;
}